

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O2

void sos::NativeFunction::greaterEqual(VariableStack *stack)

{
  int iVar1;
  int iVar2;
  string sStack_38;
  
  VariableStack::take_abi_cxx11_(&sStack_38,stack);
  iVar1 = std::__cxx11::stoi(&sStack_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&sStack_38);
  VariableStack::take_abi_cxx11_(&sStack_38,stack);
  iVar2 = std::__cxx11::stoi(&sStack_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&sStack_38);
  VariableStack::load(stack,iVar2 <= iVar1);
  return;
}

Assistant:

void sos::NativeFunction::greaterEqual(sos::VariableStack *stack) {
    int left = std::stoi(stack->take());
    int right = std::stoi(stack->take());
    stack->load(left >= right);
}